

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_slice.c
# Opt level: O2

_Bool slice_fseek(ALLEGRO_FILE *f,int64_t offset,int whence)

{
  _Bool _Var1;
  undefined8 *puVar2;
  long lVar3;
  ulong uVar4;
  _Bool _Var5;
  ulong uVar6;
  ulong uVar7;
  
  puVar2 = (undefined8 *)al_get_file_userdata(f);
  if (whence == 2) {
    uVar6 = puVar2[1];
    lVar3 = puVar2[3];
  }
  else {
    if (whence != 1) {
      if (whence != 0) {
        return false;
      }
      uVar4 = puVar2[1];
      uVar6 = uVar4;
      goto LAB_00159791;
    }
    uVar6 = puVar2[1];
    lVar3 = puVar2[2];
  }
  uVar4 = lVar3 + uVar6;
LAB_00159791:
  uVar4 = uVar4 + offset;
  uVar7 = uVar6;
  if (((uVar6 <= uVar4) && (uVar7 = uVar4, uVar6 + puVar2[3] < uVar4)) &&
     (uVar7 = uVar6 + puVar2[3], (*(byte *)(puVar2 + 4) & 4) != 0)) {
    uVar7 = uVar4;
  }
  _Var5 = false;
  _Var1 = al_fseek((ALLEGRO_FILE *)*puVar2,uVar7,0);
  if (_Var1) {
    uVar7 = uVar7 - puVar2[1];
    puVar2[2] = uVar7;
    _Var5 = true;
    if ((ulong)puVar2[3] < uVar7) {
      puVar2[3] = uVar7;
    }
  }
  return _Var5;
}

Assistant:

static bool slice_fseek(ALLEGRO_FILE *f, int64_t offset, int whence)
{
   SLICE_DATA *slice = al_get_file_userdata(f);
   
   if (whence == ALLEGRO_SEEK_SET) {
      offset = slice->anchor + offset;
   }
   else if (whence == ALLEGRO_SEEK_CUR) {
      offset = slice->anchor + slice->pos + offset;
   }
   else if (whence == ALLEGRO_SEEK_END) {
      offset = slice->anchor + slice->size + offset;
   }
   else {
      return false;
   }
   
   if ((size_t) offset < slice->anchor) {
      offset = slice->anchor;
   }
   else if ((size_t) offset > slice->anchor + slice->size) {
      if (!(slice->mode & SLICE_EXPANDABLE)) {
         offset = slice->anchor + slice->size;
      }
   }
   
   if (al_fseek(slice->fp, offset, ALLEGRO_SEEK_SET)) {
      slice->pos = offset - slice->anchor;
      if (slice->pos > slice->size)
         slice->size = slice->pos;
      return true;
   }
   
   return false;
}